

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_panel_begin(nk_context *ctx,char *title,nk_panel_type panel_type)

{
  nk_rect *pnVar1;
  int iVar2;
  nk_user_font *pnVar3;
  nk_window *pnVar4;
  nk_panel *pnVar5;
  nk_vec2 nVar6;
  nk_vec2 nVar7;
  nk_rect r;
  nk_rect r_00;
  nk_rect rect;
  nk_rect r_01;
  nk_rect rect_00;
  long lVar8;
  nk_rect bounds;
  nk_rect bounds_00;
  nk_rect b;
  nk_rect rect_01;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  byte bVar12;
  nk_bool nVar13;
  int iVar14;
  nk_style *style_00;
  nk_panel_type in_EDX;
  char *in_RSI;
  nk_context *in_RDI;
  float fVar15;
  float fVar16;
  float fVar17;
  nk_rect nVar18;
  nk_rect clip;
  nk_rect body;
  float t;
  nk_rect label;
  int text_len;
  nk_flags ws_1;
  nk_flags ws;
  nk_rect button;
  nk_style_item *background;
  nk_rect header_1;
  nk_text text;
  nk_rect header;
  int left_mouse_click_in_cursor;
  int left_mouse_clicked;
  int left_mouse_down;
  nk_vec2 panel_padding;
  nk_vec2 scrollbar_size;
  nk_user_font *font;
  nk_style *style;
  nk_command_buffer *out;
  nk_panel *layout;
  nk_window *win;
  nk_input *in;
  nk_size in_stack_fffffffffffffe98;
  nk_bool in_stack_fffffffffffffea0;
  nk_buttons in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffea8;
  float in_stack_fffffffffffffeac;
  float fVar19;
  float in_stack_fffffffffffffeb0;
  float in_stack_fffffffffffffeb4;
  uint in_stack_fffffffffffffeb8;
  nk_symbol_type in_stack_fffffffffffffebc;
  float in_stack_fffffffffffffec0;
  nk_color in_stack_fffffffffffffec4;
  nk_command_buffer *style_01;
  nk_color c;
  nk_button_behavior in_stack_fffffffffffffec8;
  nk_symbol_type in_stack_fffffffffffffecc;
  undefined4 uVar20;
  float fVar21;
  undefined4 in_stack_fffffffffffffed8;
  float in_stack_fffffffffffffedc;
  float fStack_120;
  float in_stack_fffffffffffffee4;
  float in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  float in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  nk_style_window *local_c0;
  float local_b4;
  float local_ac;
  float local_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  uint local_4;
  
  if (((in_RDI == (nk_context *)0x0) || (in_RDI->current == (nk_window *)0x0)) ||
     (in_RDI->current->layout == (nk_panel *)0x0)) {
    local_4 = 0;
  }
  else {
    nk_zero((void *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
            in_stack_fffffffffffffe98);
    if (((in_RDI->current->flags & 0x2000) == 0) && ((in_RDI->current->flags & 0x4000) == 0)) {
      style_00 = &in_RDI->style;
      pnVar3 = style_00->font;
      pnVar4 = in_RDI->current;
      pnVar5 = pnVar4->layout;
      if ((pnVar4->flags & 0x400) == 0) {
        uVar20 = SUB84(in_RDI,0);
        fVar21 = (float)((ulong)in_RDI >> 0x20);
      }
      else {
        uVar20 = 0;
        fVar21 = 0.0;
      }
      lVar8 = CONCAT44(fVar21,uVar20);
      nVar6 = (in_RDI->style).window.scrollbar_size;
      nVar7 = nk_panel_get_padding(style_00,in_EDX);
      fStack_5c = nVar7.y;
      if (((pnVar4->flags & 2) != 0) && ((pnVar4->flags & 0x1000) == 0)) {
        nk_panel_has_header(pnVar4->flags,in_RSI);
        iVar14 = *(int *)(lVar8 + 0x104);
        iVar2 = *(int *)(lVar8 + 0x108);
        nVar18.y = (float)in_stack_fffffffffffffeb8;
        nVar18.x = in_stack_fffffffffffffeb4;
        nVar18.w = (float)in_stack_fffffffffffffebc;
        nVar18.h = in_stack_fffffffffffffec0;
        nVar13 = nk_input_has_mouse_click_down_in_rect
                           ((nk_input *)
                            CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                            in_stack_fffffffffffffea4,nVar18,in_stack_fffffffffffffea0);
        if ((iVar14 != 0) && ((nVar13 != 0 && (iVar2 == 0)))) {
          (pnVar4->bounds).x = (pnVar4->bounds).x + *(float *)(lVar8 + 0x154);
          (pnVar4->bounds).y = (pnVar4->bounds).y + *(float *)(lVar8 + 0x158);
          *(float *)(lVar8 + 0x10c) = *(float *)(lVar8 + 0x154) + *(float *)(lVar8 + 0x10c);
          *(float *)(lVar8 + 0x110) = *(float *)(lVar8 + 0x158) + *(float *)(lVar8 + 0x110);
          (in_RDI->style).cursor_active = (in_RDI->style).cursors[2];
        }
      }
      pnVar5->type = in_EDX;
      pnVar5->flags = pnVar4->flags;
      fVar15 = (pnVar4->bounds).y;
      (pnVar5->bounds).x = (pnVar4->bounds).x;
      (pnVar5->bounds).y = fVar15;
      fVar15 = (pnVar4->bounds).h;
      (pnVar5->bounds).w = (pnVar4->bounds).w;
      (pnVar5->bounds).h = fVar15;
      local_60 = nVar7.x;
      (pnVar5->bounds).x = local_60 + (pnVar5->bounds).x;
      (pnVar5->bounds).w = (pnVar5->bounds).w - (local_60 + local_60);
      if ((pnVar4->flags & 1) == 0) {
        pnVar5->border = 0.0;
      }
      else {
        fVar15 = nk_panel_get_border(style_00,pnVar4->flags,in_EDX);
        pnVar5->border = fVar15;
        in_stack_fffffffffffffec8 = (nk_button_behavior)pnVar5;
        in_stack_fffffffffffffecc = (nk_symbol_type)((ulong)pnVar5 >> 0x20);
        nVar18 = nk_shrink_rect(pnVar5->bounds,pnVar5->border);
        *(long *)(CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8) + 8) = nVar18._0_8_;
        *(long *)(CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8) + 0x10) =
             nVar18._8_8_;
      }
      pnVar5->at_y = (pnVar5->bounds).y;
      pnVar5->at_x = (pnVar5->bounds).x;
      pnVar5->max_x = 0.0;
      pnVar5->header_height = 0.0;
      pnVar5->footer_height = 0.0;
      nk_layout_reset_min_row_height(in_RDI);
      (pnVar5->row).index = 0;
      (pnVar5->row).columns = 0;
      (pnVar5->row).ratio = (float *)0x0;
      (pnVar5->row).item_width = 0.0;
      (pnVar5->row).tree_depth = 0;
      (pnVar5->row).height = fStack_5c;
      pnVar5->has_scrolling = 1;
      if ((pnVar4->flags & 0x20) == 0) {
        local_58 = nVar6.x;
        (pnVar5->bounds).w = (pnVar5->bounds).w - local_58;
      }
      nVar13 = nk_panel_is_nonblock(in_EDX);
      if (nVar13 == 0) {
        pnVar5->footer_height = 0.0;
        if (((pnVar4->flags & 0x20) == 0) || ((pnVar4->flags & 4) != 0)) {
          fStack_54 = nVar6.y;
          pnVar5->footer_height = fStack_54;
        }
        (pnVar5->bounds).h = (pnVar5->bounds).h - pnVar5->footer_height;
      }
      nVar13 = nk_panel_has_header(pnVar4->flags,in_RSI);
      style_01 = (nk_command_buffer *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0);
      if (nVar13 != 0) {
        pnVar1 = &pnVar4->bounds;
        local_b4 = pnVar1->x;
        local_ac = (pnVar4->bounds).w;
        uVar9 = pnVar1->x;
        uVar10 = pnVar1->y;
        uVar11 = pnVar1->w;
        rect_01.w = (float)uVar11;
        rect_01.y = (float)uVar10;
        rect_01.x = (float)uVar9;
        fVar15 = (in_RDI->style).window.header.padding.y;
        fVar19 = (in_RDI->style).window.header.label_padding.y;
        fVar15 = fVar19 + fVar19 + fVar15 + fVar15 + pnVar3->height;
        pnVar5->header_height = fVar15;
        (pnVar5->bounds).y = fVar15 + (pnVar5->bounds).y;
        (pnVar5->bounds).h = (pnVar5->bounds).h - fVar15;
        pnVar5->at_y = fVar15 + pnVar5->at_y;
        if (in_RDI->active == pnVar4) {
          local_c0 = (nk_style_window *)&(in_RDI->style).window.header.active;
          fVar19 = in_stack_fffffffffffffeac;
        }
        else {
          rect_01.h = fVar15;
          nVar13 = nk_input_is_mouse_hovering_rect(&in_RDI->input,rect_01);
          fVar19 = in_stack_fffffffffffffeac;
          if (nVar13 == 0) {
            local_c0 = &(in_RDI->style).window;
          }
          else {
            local_c0 = (nk_style_window *)&(in_RDI->style).window.header.hover;
          }
        }
        if ((local_c0->header).normal.type == NK_STYLE_ITEM_IMAGE) {
          nk_rgba(0,0,0,0);
          r_00.y = (float)in_stack_fffffffffffffecc;
          r_00.x = (float)in_stack_fffffffffffffec8;
          r_00.w = (float)uVar20;
          r_00.h = fVar21;
          nk_draw_image((nk_command_buffer *)
                        CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),r_00,
                        (nk_image *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                        in_stack_fffffffffffffec4);
        }
        else {
          rect.y = (float)in_stack_fffffffffffffecc;
          rect.x = (float)in_stack_fffffffffffffec8;
          rect.w = (float)uVar20;
          rect.h = fVar21;
          nk_fill_rect((nk_command_buffer *)
                       CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),rect,
                       in_stack_fffffffffffffeb4,in_stack_fffffffffffffec4);
        }
        fVar16 = (in_RDI->style).window.header.padding.y;
        fVar15 = (fVar15 + 1.0) - (fVar16 + fVar16);
        if ((pnVar4->flags & 8) != 0) {
          if ((in_RDI->style).window.header.align == NK_HEADER_RIGHT) {
            local_ac = local_ac -
                       (fVar15 + (in_RDI->style).window.header.spacing.x +
                       (in_RDI->style).window.header.padding.x);
          }
          else {
            local_b4 = fVar15 + (in_RDI->style).window.header.spacing.x +
                       (in_RDI->style).window.header.padding.x + local_b4;
          }
          bounds.y = in_stack_fffffffffffffee8;
          bounds.x = in_stack_fffffffffffffee4;
          bounds.w = (float)in_stack_fffffffffffffeec;
          bounds.h = in_stack_fffffffffffffef0;
          nVar13 = nk_do_button_symbol((nk_flags *)
                                       CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)
                                       ,(nk_command_buffer *)CONCAT44(fVar21,uVar20),bounds,
                                       in_stack_fffffffffffffecc,in_stack_fffffffffffffec8,
                                       (nk_style_button *)
                                       CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
                                       ,(nk_input *)
                                        CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8
                                                ),
                                       (nk_user_font *)
                                       CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                                      );
          if ((nVar13 != 0) && ((pnVar4->flags & 0x1000) == 0)) {
            pnVar5->flags = pnVar5->flags | 0x2000;
            pnVar5->flags = pnVar5->flags & 0xffff7fff;
          }
        }
        style_01 = (nk_command_buffer *)((ulong)(uint)in_stack_fffffffffffffec4 << 0x20);
        if ((pnVar4->flags & 0x10) != 0) {
          if ((in_RDI->style).window.header.align == NK_HEADER_RIGHT) {
            if ((pnVar4->flags & 8) == 0) {
              local_ac = local_ac - (in_RDI->style).window.header.padding.x;
            }
            local_ac = local_ac - (fVar15 + (in_RDI->style).window.header.spacing.x);
          }
          else {
            local_b4 = fVar15 + (in_RDI->style).window.header.spacing.x +
                       (in_RDI->style).window.header.padding.x + local_b4;
          }
          style_01 = &pnVar4->buffer;
          if ((pnVar5->flags & 0x8000) == 0) {
            in_stack_fffffffffffffebc = (in_RDI->style).window.header.minimize_symbol;
          }
          else {
            in_stack_fffffffffffffebc = (in_RDI->style).window.header.maximize_symbol;
          }
          bounds_00.y = in_stack_fffffffffffffee8;
          bounds_00.x = in_stack_fffffffffffffee4;
          bounds_00.w = (float)in_stack_fffffffffffffeec;
          bounds_00.h = in_stack_fffffffffffffef0;
          nVar13 = nk_do_button_symbol((nk_flags *)
                                       CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)
                                       ,(nk_command_buffer *)CONCAT44(fVar21,uVar20),bounds_00,
                                       in_stack_fffffffffffffecc,in_stack_fffffffffffffec8,
                                       (nk_style_button *)style_01,
                                       (nk_input *)
                                       CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                                       ,(nk_user_font *)
                                        CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00
                                                ));
          if ((nVar13 != 0) && ((pnVar4->flags & 0x1000) == 0)) {
            if ((pnVar5->flags & 0x8000) == 0) {
              in_stack_fffffffffffffeb8 = pnVar5->flags | 0x8000;
            }
            else {
              in_stack_fffffffffffffeb8 = pnVar5->flags & 0xffff7fff;
            }
            pnVar5->flags = in_stack_fffffffffffffeb8;
          }
        }
        iVar14 = nk_strlen(in_RSI);
        fVar16 = (*pnVar3->width)(pnVar3->userdata,pnVar3->height,in_RSI,iVar14);
        nVar6 = nk_vec2(0.0,0.0);
        fVar17 = (in_RDI->style).window.header.label_padding.x +
                 local_b4 + (in_RDI->style).window.header.padding.x;
        fVar15 = (in_RDI->style).window.header.spacing.x;
        in_stack_fffffffffffffeac = fVar15 + fVar15 + fVar16;
        in_stack_fffffffffffffeb4 = in_stack_fffffffffffffeac;
        if ((local_b4 + local_ac) - fVar17 <= in_stack_fffffffffffffeac) {
          in_stack_fffffffffffffeb4 = (local_b4 + local_ac) - fVar17;
        }
        if (0.0 <= in_stack_fffffffffffffeb4) {
          in_stack_fffffffffffffeb0 = in_stack_fffffffffffffeac;
          if ((local_b4 + local_ac) - fVar17 <= in_stack_fffffffffffffeac) {
            in_stack_fffffffffffffeac = (local_b4 + local_ac) - fVar17;
            in_stack_fffffffffffffeb0 = in_stack_fffffffffffffeac;
          }
        }
        else {
          in_stack_fffffffffffffeac = fVar19;
          in_stack_fffffffffffffeb0 = 0.0;
        }
        b.y = nVar6.x;
        b.x = (float)in_stack_fffffffffffffef8;
        b.w = nVar6.y;
        b.h = fVar16;
        nk_widget_text((nk_command_buffer *)
                       CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),b,
                       (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                       (int)in_stack_fffffffffffffee4,
                       (nk_text *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                       (nk_flags)fVar21,
                       (nk_user_font *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)
                      );
      }
      c = SUB84((ulong)style_01 >> 0x20,0);
      if (((pnVar5->flags & 0x8000) == 0) && ((pnVar5->flags & 0x800) == 0)) {
        if ((in_RDI->style).window.fixed_background.type == NK_STYLE_ITEM_IMAGE) {
          r_01.y = (float)in_stack_fffffffffffffecc;
          r_01.x = (float)in_stack_fffffffffffffec8;
          r_01.w = (float)uVar20;
          r_01.h = fVar21;
          nk_draw_image((nk_command_buffer *)
                        CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),r_01,
                        (nk_image *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),c)
          ;
        }
        else {
          rect_00.y = (float)in_stack_fffffffffffffecc;
          rect_00.x = (float)in_stack_fffffffffffffec8;
          rect_00.w = (float)uVar20;
          rect_00.h = fVar21;
          nk_fill_rect((nk_command_buffer *)
                       CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),rect_00,
                       in_stack_fffffffffffffeb4,c);
        }
      }
      fVar21 = (pnVar5->bounds).y;
      fVar15 = (pnVar5->bounds).w;
      fVar19 = (pnVar5->bounds).h;
      (pnVar5->clip).x = (pnVar5->bounds).x;
      (pnVar5->clip).y = fVar21;
      (pnVar5->clip).w = fVar15;
      (pnVar5->clip).h = fVar19;
      fVar21 = (pnVar5->clip).x;
      fVar15 = (pnVar5->clip).y;
      nk_unify((nk_rect *)&stack0xfffffffffffffedc,&(pnVar4->buffer).clip,fVar21,fVar15,
               fVar21 + (pnVar5->clip).w,fVar15 + (pnVar5->clip).h);
      r.y = in_stack_fffffffffffffeac;
      r.x = (float)in_stack_fffffffffffffea8;
      r.w = in_stack_fffffffffffffeb0;
      r.h = in_stack_fffffffffffffeb4;
      nk_push_scissor((nk_command_buffer *)
                      CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),r);
      (pnVar5->clip).x = in_stack_fffffffffffffedc;
      (pnVar5->clip).y = fStack_120;
      (pnVar5->clip).w = in_stack_fffffffffffffee4;
      (pnVar5->clip).h = in_stack_fffffffffffffee8;
      bVar12 = 0;
      if ((pnVar5->flags & 0x2000) == 0) {
        bVar12 = (pnVar5->flags & 0x8000) != 0 ^ 0xff;
      }
      local_4 = (uint)(bVar12 & 1);
    }
    else {
      nk_zero((void *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
              in_stack_fffffffffffffe98);
      in_RDI->current->layout->type = in_EDX;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

NK_LIB nk_bool
nk_panel_begin(struct nk_context *ctx, const char *title, enum nk_panel_type panel_type)
{
struct nk_input *in;
struct nk_window *win;
struct nk_panel *layout;
struct nk_command_buffer *out;
const struct nk_style *style;
const struct nk_user_font *font;

struct nk_vec2 scrollbar_size;
struct nk_vec2 panel_padding;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout) return 0;
nk_zero(ctx->current->layout, sizeof(*ctx->current->layout));
if ((ctx->current->flags & NK_WINDOW_HIDDEN) || (ctx->current->flags & NK_WINDOW_CLOSED)) {
nk_zero(ctx->current->layout, sizeof(struct nk_panel));
ctx->current->layout->type = panel_type;
return 0;
}
/* pull state into local stack */
style = &ctx->style;
font = style->font;
win = ctx->current;
layout = win->layout;
out = &win->buffer;
in = (win->flags & NK_WINDOW_NO_INPUT) ? 0: &ctx->input;
#ifdef NK_INCLUDE_COMMAND_USERDATA
win->buffer.userdata = ctx->userdata;
#endif
/* pull style configuration into local stack */
scrollbar_size = style->window.scrollbar_size;
panel_padding = nk_panel_get_padding(style, panel_type);

/* window movement */
if ((win->flags & NK_WINDOW_MOVABLE) && !(win->flags & NK_WINDOW_ROM)) {
int left_mouse_down;
int left_mouse_clicked;
int left_mouse_click_in_cursor;

/* calculate draggable window space */
struct nk_rect header;
header.x = win->bounds.x;
header.y = win->bounds.y;
header.w = win->bounds.w;
if (nk_panel_has_header(win->flags, title)) {
header.h = font->height + 2.0f * style->window.header.padding.y;
header.h += 2.0f * style->window.header.label_padding.y;
} else header.h = panel_padding.y;

/* window movement by dragging */
left_mouse_down = in->mouse.buttons[NK_BUTTON_LEFT].down;
left_mouse_clicked = (int)in->mouse.buttons[NK_BUTTON_LEFT].clicked;
left_mouse_click_in_cursor = nk_input_has_mouse_click_down_in_rect(in,
NK_BUTTON_LEFT, header, nk_true);
if (left_mouse_down && left_mouse_click_in_cursor && !left_mouse_clicked) {
win->bounds.x = win->bounds.x + in->mouse.delta.x;
win->bounds.y = win->bounds.y + in->mouse.delta.y;
in->mouse.buttons[NK_BUTTON_LEFT].clicked_pos.x += in->mouse.delta.x;
in->mouse.buttons[NK_BUTTON_LEFT].clicked_pos.y += in->mouse.delta.y;
ctx->style.cursor_active = ctx->style.cursors[NK_CURSOR_MOVE];
}
}

/* setup panel */
layout->type = panel_type;
layout->flags = win->flags;
layout->bounds = win->bounds;
layout->bounds.x += panel_padding.x;
layout->bounds.w -= 2*panel_padding.x;
if (win->flags & NK_WINDOW_BORDER) {
layout->border = nk_panel_get_border(style, win->flags, panel_type);
layout->bounds = nk_shrink_rect(layout->bounds, layout->border);
} else layout->border = 0;
layout->at_y = layout->bounds.y;
layout->at_x = layout->bounds.x;
layout->max_x = 0;
layout->header_height = 0;
layout->footer_height = 0;
nk_layout_reset_min_row_height(ctx);
layout->row.index = 0;
layout->row.columns = 0;
layout->row.ratio = 0;
layout->row.item_width = 0;
layout->row.tree_depth = 0;
layout->row.height = panel_padding.y;
layout->has_scrolling = nk_true;
if (!(win->flags & NK_WINDOW_NO_SCROLLBAR))
layout->bounds.w -= scrollbar_size.x;
if (!nk_panel_is_nonblock(panel_type)) {
layout->footer_height = 0;
if (!(win->flags & NK_WINDOW_NO_SCROLLBAR) || win->flags & NK_WINDOW_SCALABLE)
layout->footer_height = scrollbar_size.y;
layout->bounds.h -= layout->footer_height;
}

/* panel header */
if (nk_panel_has_header(win->flags, title))
{
struct nk_text text;
struct nk_rect header;
const struct nk_style_item *background = 0;

/* calculate header bounds */
header.x = win->bounds.x;
header.y = win->bounds.y;
header.w = win->bounds.w;
header.h = font->height + 2.0f * style->window.header.padding.y;
header.h += (2.0f * style->window.header.label_padding.y);

/* shrink panel by header */
layout->header_height = header.h;
layout->bounds.y += header.h;
layout->bounds.h -= header.h;
layout->at_y += header.h;

/* select correct header background and text color */
if (ctx->active == win) {
background = &style->window.header.active;
text.text = style->window.header.label_active;
} else if (nk_input_is_mouse_hovering_rect(&ctx->input, header)) {
background = &style->window.header.hover;
text.text = style->window.header.label_hover;
} else {
background = &style->window.header.normal;
text.text = style->window.header.label_normal;
}

/* draw header background */
header.h += 1.0f;
if (background->type == NK_STYLE_ITEM_IMAGE) {
text.background = nk_rgba(0,0,0,0);
nk_draw_image(&win->buffer, header, &background->data.image, nk_white);
} else {
text.background = background->data.color;
nk_fill_rect(out, header, 0, background->data.color);
}

/* window close button */
{struct nk_rect button;
button.y = header.y + style->window.header.padding.y;
button.h = header.h - 2 * style->window.header.padding.y;
button.w = button.h;
if (win->flags & NK_WINDOW_CLOSABLE) {
nk_flags ws = 0;
if (style->window.header.align == NK_HEADER_RIGHT) {
button.x = (header.w + header.x) - (button.w + style->window.header.padding.x);
header.w -= button.w + style->window.header.spacing.x + style->window.header.padding.x;
} else {
button.x = header.x + style->window.header.padding.x;
header.x += button.w + style->window.header.spacing.x + style->window.header.padding.x;
}

if (nk_do_button_symbol(&ws, &win->buffer, button,
style->window.header.close_symbol, NK_BUTTON_DEFAULT,
&style->window.header.close_button, in, style->font) && !(win->flags & NK_WINDOW_ROM))
{
layout->flags |= NK_WINDOW_HIDDEN;
layout->flags &= (nk_flags)~NK_WINDOW_MINIMIZED;
}
}

/* window minimize button */
if (win->flags & NK_WINDOW_MINIMIZABLE) {
nk_flags ws = 0;
if (style->window.header.align == NK_HEADER_RIGHT) {
button.x = (header.w + header.x) - button.w;
if (!(win->flags & NK_WINDOW_CLOSABLE)) {
button.x -= style->window.header.padding.x;
header.w -= style->window.header.padding.x;
}
header.w -= button.w + style->window.header.spacing.x;
} else {
button.x = header.x;
header.x += button.w + style->window.header.spacing.x + style->window.header.padding.x;
}
if (nk_do_button_symbol(&ws, &win->buffer, button, (layout->flags & NK_WINDOW_MINIMIZED)?
style->window.header.maximize_symbol: style->window.header.minimize_symbol,
NK_BUTTON_DEFAULT, &style->window.header.minimize_button, in, style->font) && !(win->flags & NK_WINDOW_ROM))
layout->flags = (layout->flags & NK_WINDOW_MINIMIZED) ?
layout->flags & (nk_flags)~NK_WINDOW_MINIMIZED:
layout->flags | NK_WINDOW_MINIMIZED;
}}

{/* window header title */
int text_len = nk_strlen(title);
struct nk_rect label = {0,0,0,0};
float t = font->width(font->userdata, font->height, title, text_len);
text.padding = nk_vec2(0,0);

label.x = header.x + style->window.header.padding.x;
label.x += style->window.header.label_padding.x;
label.y = header.y + style->window.header.label_padding.y;
label.h = font->height + 2 * style->window.header.label_padding.y;
label.w = t + 2 * style->window.header.spacing.x;
label.w = NK_CLAMP(0, label.w, header.x + header.w - label.x);
nk_widget_text(out, label,(const char*)title, text_len, &text, NK_TEXT_LEFT, font);}
}

/* draw window background */
if (!(layout->flags & NK_WINDOW_MINIMIZED) && !(layout->flags & NK_WINDOW_DYNAMIC)) {
struct nk_rect body;
body.x = win->bounds.x;
body.w = win->bounds.w;
body.y = (win->bounds.y + layout->header_height);
body.h = (win->bounds.h - layout->header_height);
if (style->window.fixed_background.type == NK_STYLE_ITEM_IMAGE)
nk_draw_image(out, body, &style->window.fixed_background.data.image, nk_white);
else nk_fill_rect(out, body, 0, style->window.fixed_background.data.color);
}

/* set clipping rectangle */
{struct nk_rect clip;
layout->clip = layout->bounds;
nk_unify(&clip, &win->buffer.clip, layout->clip.x, layout->clip.y,
layout->clip.x + layout->clip.w, layout->clip.y + layout->clip.h);
nk_push_scissor(out, clip);
layout->clip = clip;}
return !(layout->flags & NK_WINDOW_HIDDEN) && !(layout->flags & NK_WINDOW_MINIMIZED);
}